

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::CompressionParameters>::dispose(ArrayBuilder<kj::CompressionParameters> *this)

{
  CompressionParameters *pCVar1;
  RemoveConst<kj::CompressionParameters> *pRVar2;
  CompressionParameters *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CompressionParameters *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (CompressionParameters *)0x0;
    this->pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    this->endPtr = (CompressionParameters *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x28,((long)pRVar2 - (long)pCVar1) / 0x28,
               ((long)pCVar3 - (long)pCVar1) / 0x28,
               ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }